

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O2

void __thiscall
MovParsedSRTTrackData::extractData(MovParsedSRTTrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  int *x;
  size_type sVar1;
  pointer ppVar2;
  byte bVar3;
  uint uVar4;
  int64_t iVar5;
  ushort *puVar6;
  ushort *puVar7;
  long lVar8;
  ulong uVar9;
  ushort uVar10;
  pointer ppVar11;
  MovParsedSRTTrackData *pMVar12;
  long lVar13;
  uint8_t *puVar14;
  ushort *puVar15;
  bool bVar16;
  uint16_t endChar;
  string prefix;
  undefined1 local_108 [16];
  char local_f8 [24];
  MovParsedSRTTrackData *local_e0;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags;
  string subtitleText;
  undefined1 local_78 [40];
  string suffix;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
  suffix._M_string_length = 0;
  prefix.field_2._M_local_buf[0] = '\0';
  suffix.field_2._M_local_buf[0] = '\0';
  subtitleText._M_dataplus._M_p = (pointer)&subtitleText.field_2;
  subtitleText._M_string_length = 0;
  subtitleText.field_2._M_local_buf[0] = '\0';
  tags.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tags.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tags.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->m_packetCnt == 0) {
    std::__cxx11::string::assign((char *)&prefix);
  }
  lVar13 = this->m_timeOffset;
  local_e0 = this;
  iVar5 = getSttsVal(this);
  x = &local_e0->m_packetCnt;
  *x = *x + 1;
  int32ToStr_abi_cxx11_((string *)local_108,x);
  std::__cxx11::string::append((string *)&prefix);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::append((char *)&prefix);
  floatToTime_abi_cxx11_((string *)local_108,(double)lVar13 / 1000.0,',');
  std::__cxx11::string::append((string *)&prefix);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::append((char *)&prefix);
  lVar13 = iVar5 + lVar13;
  floatToTime_abi_cxx11_((string *)local_108,(double)lVar13 / 1000.0,',');
  std::__cxx11::string::append((string *)&prefix);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::push_back((char)&prefix);
  puVar6 = (ushort *)(buff + size);
  puVar14 = pkt->data;
  memcpy(puVar14,prefix._M_dataplus._M_p,prefix._M_string_length);
  pMVar12 = local_e0;
  sVar1 = prefix._M_string_length;
  uVar4 = 0;
  while (uVar4 == 0) {
    uVar10 = *(ushort *)buff;
    buff = (uint8_t *)((long)buff + 2);
    uVar4 = (uint)(ushort)(uVar10 << 8 | uVar10 >> 8);
  }
  local_108._0_8_ = local_f8;
  puVar15 = (ushort *)((ulong)uVar4 + (long)buff);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,buff,puVar15);
  std::__cxx11::string::operator=((string *)&subtitleText,(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  while (puVar15 < puVar6) {
    puVar7 = puVar15 + 4;
    lVar8 = ((ulong)(byte)puVar15[1] << 8 |
            (long)(int)((uint)(byte)*puVar15 << 0x18) | (ulong)*(byte *)((long)puVar15 + 1) << 0x10)
            + (ulong)*(byte *)((long)puVar15 + 3) + -8;
    if (lVar8 == 1) {
      uVar9 = 0;
      for (lVar8 = 0; (int)lVar8 != 8; lVar8 = lVar8 + 1) {
        uVar9 = uVar9 << 8 | (ulong)*(byte *)((long)puVar7 + lVar8);
      }
      puVar7 = puVar15 + 8;
      lVar8 = uVar9 - 8;
    }
    uVar4 = *(uint *)(puVar15 + 2);
    if ((uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18) ==
        0x7374796c) {
      uVar9 = (ulong)(ushort)(*puVar7 << 8 | *puVar7 >> 8);
      puVar15 = puVar7 + 1;
      while (bVar16 = uVar9 != 0, uVar9 = uVar9 - 1, bVar16) {
        std::__cxx11::string::assign((char *)&prefix);
        std::__cxx11::string::assign((char *)&suffix);
        uVar10 = *puVar15 << 8 | *puVar15 >> 8;
        endChar = puVar15[1] << 8 | puVar15[1] >> 8;
        if (uVar10 < endChar) {
          bVar3 = (byte)puVar15[3];
          if ((bVar3 & 1) != 0) {
            std::__cxx11::string::append((char *)&prefix);
            std::__cxx11::string::insert((ulong)&suffix,(char *)0x0);
            bVar3 = (byte)puVar15[3];
          }
          if ((bVar3 & 2) != 0) {
            std::__cxx11::string::append((char *)&prefix);
            std::__cxx11::string::insert((ulong)&suffix,(char *)0x0);
            bVar3 = (byte)puVar15[3];
          }
          if ((bVar3 & 4) != 0) {
            std::__cxx11::string::append((char *)&prefix);
            std::__cxx11::string::insert((ulong)&suffix,(char *)0x0);
          }
          ppVar2 = tags.
                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_78._0_2_ = uVar10;
          std::__cxx11::string::string((string *)(local_78 + 8),(string *)&prefix);
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_108,
                     (pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_78);
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_insert_rval(&tags,(const_iterator)ppVar2,
                           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_108);
          std::__cxx11::string::~string((string *)(local_108 + 8));
          std::__cxx11::string::~string((string *)(local_78 + 8));
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<unsigned_short&,std::__cxx11::string&>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)&tags,&endChar,&suffix);
          pMVar12 = local_e0;
        }
        puVar15 = puVar15 + 6;
      }
    }
    else {
      puVar15 = (ushort *)((long)puVar7 + lVar8);
    }
  }
  if (tags.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      tags.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
              ();
    ppVar2 = tags.
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar11 = tags.
                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar2;
        ppVar11 = ppVar11 + 1) {
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_108,ppVar11);
      std::__cxx11::string::insert((ulong)&subtitleText,(string *)(long)(int)local_108._0_4_);
      std::__cxx11::string::~string((string *)(local_108 + 8));
    }
  }
  puVar14 = puVar14 + sVar1;
  memcpy(puVar14,subtitleText._M_dataplus._M_p,subtitleText._M_string_length);
  (puVar14 + subtitleText._M_string_length)[0] = '\n';
  (puVar14 + subtitleText._M_string_length)[1] = '\n';
  pMVar12->m_timeOffset = lVar13;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&tags);
  std::__cxx11::string::~string((string *)&subtitleText);
  std::__cxx11::string::~string((string *)&suffix);
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void extractData(AVPacket* pkt, uint8_t* buff, int size) override
    {
        uint8_t* end = buff + size;
        std::string prefix;
        std::string suffix;
        std::string subtitleText;
        std::vector<pair<int, string>> tags;
        if (m_packetCnt == 0)
            prefix = "\xEF\xBB\xBF";  // UTF-8 header
        int64_t startTime = m_timeOffset;
        int64_t endTime = startTime + getSttsVal();
        prefix += int32ToStr(++m_packetCnt);
        prefix += "\n";
        prefix += floatToTime(static_cast<double>(startTime) / 1e3, ',');
        prefix += " --> ";
        prefix += floatToTime(static_cast<double>(endTime) / 1e3, ',');
        prefix += '\n';
        uint8_t* dst = pkt->data;
        memcpy(dst, prefix.c_str(), prefix.length());
        dst += prefix.length();
        uint32_t unitSize = 0;

        while (unitSize == 0)
        {
            unitSize = (buff[0] << 8) | buff[1];
            buff += 2;
        }
        subtitleText = std::string(reinterpret_cast<char*>(buff), unitSize);
        buff += unitSize;

        while (buff < end)
        {
            int64_t modifierLen = (buff[0] << 24) | (buff[1] << 16) | (buff[2] << 8) | buff[3];
            uint32_t modifierType = (buff[4] << 24) | (buff[5] << 16) | (buff[6] << 8) | buff[7];
            buff += 8;
            modifierLen -= 8;
            if (modifierLen == 1)  // 64-bit length
            {
                modifierLen = 0;
                for (int i = 0; i < 8; i++)
                {
                    modifierLen <<= 8;
                    modifierLen |= *buff++;
                }
                modifierLen -= 8;
            }
            if (modifierType == 0x7374796C)  // 'styl' box
            {
                auto entry_count = static_cast<uint16_t>(buff[0] << 8 | buff[1]);
                buff += 2;
                for (size_t i = 0; i < entry_count; i++)
                {
                    prefix = "";
                    suffix = "";
                    auto startChar = static_cast<uint16_t>(buff[0] << 8 | buff[1]);
                    auto endChar = static_cast<uint16_t>(buff[2] << 8 | buff[3]);
                    buff += 6;  // startChar, endChar, font_ID
                    if (startChar < endChar)
                    {
                        if (*buff & 1)
                        {
                            prefix += "<b>";
                            suffix.insert(0, "</b>");
                        }
                        if (*buff & 2)
                        {
                            prefix += "<i>";
                            suffix.insert(0, "</i>");
                        }
                        if (*buff & 4)
                        {
                            prefix += "<u>";
                            suffix.insert(0, "</u>");
                        }
                        tags.insert(tags.begin(), std::make_pair(startChar, prefix));
                        tags.emplace_back(endChar, suffix);
                    }
                    buff += 6;  // font-size, text-color-rgba[4]
                }
            }
            else
                buff += modifierLen;
        }
        if (!tags.empty())
        {
            sort(tags.begin(), tags.end(), greater<>());
            for (auto [fst, snd] : tags) subtitleText.insert(fst, snd);
        }
        memcpy(dst, subtitleText.c_str(), subtitleText.length());
        dst += subtitleText.length();
        *dst++ = '\n';
        *dst = '\n';
        m_timeOffset = endTime;
    }